

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetacontainer.cpp
# Opt level: O3

void __thiscall
QMetaContainer::advanceConstIterator(QMetaContainer *this,void *iterator,qsizetype step)

{
  QMetaContainerInterface *pQVar1;
  
  pQVar1 = this->d_ptr;
  if ((pQVar1 != (QMetaContainerInterface *)0x0) &&
     (pQVar1->createConstIteratorFn != (CreateConstIteratorFn)0x0)) {
    (*pQVar1->advanceConstIteratorFn)(iterator,step);
    return;
  }
  return;
}

Assistant:

bool QMetaContainer::hasConstIterator() const
{
    if (!d_ptr || !d_ptr->createConstIteratorFn)
        return false;
    Q_ASSERT(d_ptr->destroyConstIteratorFn);
    Q_ASSERT(d_ptr->compareConstIteratorFn);
    Q_ASSERT(d_ptr->copyConstIteratorFn);
    Q_ASSERT(d_ptr->advanceConstIteratorFn);
    Q_ASSERT(d_ptr->diffConstIteratorFn);
    return true;
}